

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

Gia_Man_t * Ssc_PerformSweepingInt(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  abctime aVar9;
  Ssc_Man_t *p;
  Gia_Man_t *pGVar10;
  abctime aVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  Gia_Man_t *p_00;
  long lVar15;
  
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  if (pCare->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCare) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x110,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  if (pAig->vCis->nSize != pCare->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x111,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar3 = Gia_ManIsNormalized(pAig);
  if (iVar3 == 0) {
    __assert_fail("Gia_ManIsNormalized(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x112,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar3 = Gia_ManIsNormalized(pCare);
  if (iVar3 == 0) {
    __assert_fail("Gia_ManIsNormalized(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x113,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  Gia_ManRandom(1);
  p = Ssc_ManStart(pAig,pCare,pPars);
  if (p == (Ssc_Man_t *)0x0) {
    pGVar10 = Gia_ManDup(pAig);
    return pGVar10;
  }
  if (p == (Ssc_Man_t *)0x1) {
    pGVar10 = Gia_ManDupZero(pAig);
    return pGVar10;
  }
  if (p->pPars->fVerbose != 0) {
    uVar4 = Ssc_GiaEstimateCare(p->pFraig,5);
    printf("Care set produced %d hits out of %d.\n",(ulong)uVar4,0x280);
  }
  do {
    Ssc_GiaRandomPiPattern(p->pFraig,5,(Vec_Int_t *)0x0);
    Ssc_GiaSimRound(p->pFraig);
    iVar3 = Ssc_GiaTransferPiPattern(pAig,p->pFraig,p->vPivot);
    if (iVar3 == 0) break;
    Ssc_GiaSimRound(pAig);
    iVar3 = Ssc_GiaClassesRefine(pAig);
    if (pPars->fVerbose != 0) {
      Gia_ManEquivPrintClasses(pAig,0,0.0);
    }
    iVar6 = pAig->vCis->nSize;
    iVar5 = Gia_ManAndNum(pAig);
  } while ((iVar5 + iVar6) / 100 < iVar3);
  aVar11 = Abc_Clock();
  p->timeSimInit = p->timeSimInit + (aVar11 - aVar9);
  Gia_ManFillValue(pAig);
  pAig->pObjs->Value = 0;
  iVar3 = 0;
  while ((iVar3 < pAig->vCis->nSize &&
         (pGVar12 = Gia_ManCi(pAig,iVar3), pGVar12 != (Gia_Obj_t *)0x0))) {
    pGVar10 = p->pFraig;
    pGVar13 = Gia_ManCi(pGVar10,iVar3);
    iVar6 = Gia_ObjId(pGVar10,(Gia_Obj_t *)((ulong)pGVar13 & 0xfffffffffffffffe));
    if (iVar6 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    pGVar12->Value = ((uint)pGVar13 & 1) + iVar6 * 2;
    iVar3 = iVar3 + 1;
  }
  Gia_ManHashStart(p->pFraig);
  Ssc_GiaResetPiPattern(pAig,pPars->nWords);
  Ssc_GiaSavePiPattern(pAig,p->vPivot);
  for (lVar15 = 0; lVar15 < pAig->nObjs; lVar15 = lVar15 + 1) {
    iVar3 = (int)lVar15;
    pGVar12 = Gia_ManObj(pAig,iVar3);
    if (pGVar12 == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(ulong *)pGVar12;
    uVar14 = *(ulong *)pGVar12 & 0x1fffffff;
    if (((~uVar4 & 0x9fffffff) == 0) || (-1 < (int)uVar4 && uVar14 != 0x1fffffff)) {
      if (pAig->iPatsPi == pPars->nWords << 6) {
        aVar9 = Abc_Clock();
        Ssc_GiaSimRound(pAig);
        Ssc_GiaClassesRefine(pAig);
        if (pPars->fVerbose != 0) {
          Gia_ManEquivPrintClasses(pAig,0,0.0);
        }
        Ssc_GiaClassesCheckPairs(pAig,p->vDisPairs);
        p->vDisPairs->nSize = 0;
        Ssc_GiaResetPiPattern(pAig,pPars->nWords);
        Ssc_GiaSavePiPattern(pAig,p->vPivot);
        aVar11 = Abc_Clock();
        p->timeSimSat = p->timeSimSat + (aVar11 - aVar9);
        uVar4 = (uint)*(undefined8 *)pGVar12;
        uVar14 = (ulong)(uVar4 & 0x1fffffff);
      }
      if ((int)uVar14 != 0x1fffffff && -1 < (int)uVar4) {
        pGVar10 = p->pFraig;
        iVar6 = Abc_LitNotCond(pGVar12[-uVar14].Value,uVar4 >> 0x1d & 1);
        uVar4 = (uint)((ulong)*(undefined8 *)pGVar12 >> 0x20);
        iVar5 = Abc_LitNotCond(pGVar12[-(ulong)(uVar4 & 0x1fffffff)].Value,uVar4 >> 0x1d & 1);
        uVar4 = Gia_ManHashAnd(pGVar10,iVar6,iVar5);
        pGVar12->Value = uVar4;
      }
      uVar4 = (uint)pAig->pReprs[lVar15] & 0xfffffff;
      if (uVar4 != 0xfffffff) {
        pGVar13 = Gia_ManObj(pAig,uVar4);
        uVar4 = pGVar12->Value;
        uVar7 = Abc_LitNotCond(pGVar13->Value,
                               ((uint)((ulong)*(undefined8 *)pGVar12 >> 0x20) ^
                               (uint)((ulong)*(undefined8 *)pGVar13 >> 0x20)) >> 0x1f);
        if (uVar4 == uVar7) {
          pAig->pReprs[lVar15] = (Gia_Rpr_t)((uint)pAig->pReprs[lVar15] | 0x10000000);
        }
        else {
          iVar6 = Abc_Lit2Var(pGVar13->Value);
          iVar5 = Abc_Lit2Var(pGVar12->Value);
          if (iVar6 == iVar5) {
            __assert_fail("Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                          ,0x157,
                          "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                         );
          }
          uVar1 = *(undefined8 *)pGVar12;
          uVar2 = *(undefined8 *)pGVar13;
          uVar4 = Abc_LitIsCompl(pGVar13->Value);
          uVar7 = Abc_LitIsCompl(pGVar12->Value);
          aVar9 = Abc_Clock();
          p->nSatCalls = p->nSatCalls + 1;
          iVar6 = Abc_Lit2Var(pGVar13->Value);
          iVar5 = Abc_Lit2Var(pGVar12->Value);
          iVar6 = Ssc_ManCheckEquivalence
                            (p,iVar6,iVar5,
                             uVar4 ^ uVar7 ^
                             ((uint)((ulong)uVar1 >> 0x20) ^ (uint)((ulong)uVar2 >> 0x20)) >> 0x1f);
          if (iVar6 == 1) {
            p->nSatCallsSat = p->nSatCallsSat + 1;
            Ssc_GiaSavePiPattern(pAig,p->vPattern);
            Vec_IntPush(p->vDisPairs,(uint)p->pAig->pReprs[lVar15] & 0xfffffff);
            Vec_IntPush(p->vDisPairs,iVar3);
            uVar4 = (uint)p->pAig->pReprs[lVar15] & 0xfffffff;
            if (uVar4 != 0) {
              Ssc_GiaResimulateOneClass(p,uVar4,iVar3);
            }
          }
          else if (iVar6 == 0) {
            p->nSatCallsUndec = p->nSatCallsUndec + 1;
          }
          else {
            if (iVar6 != -1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                            ,0x171,
                            "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                           );
            }
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            uVar4 = Abc_LitNotCond(pGVar13->Value,
                                   ((uint)((ulong)*(undefined8 *)pGVar12 >> 0x20) ^
                                   (uint)((ulong)*(undefined8 *)pGVar13 >> 0x20)) >> 0x1f);
            pGVar12->Value = uVar4;
            pAig->pReprs[lVar15] = (Gia_Rpr_t)((uint)pAig->pReprs[lVar15] | 0x10000000);
          }
          aVar11 = Abc_Clock();
          p->timeSat = p->timeSat + (aVar11 - aVar9);
        }
      }
    }
  }
  if (1 < pAig->iPatsPi) {
    aVar9 = Abc_Clock();
    while (pAig->iPatsPi < pPars->nWords * 0x40) {
      Ssc_GiaSavePiPattern(pAig,p->vPivot);
    }
    Ssc_GiaSimRound(pAig);
    Ssc_GiaClassesRefine(pAig);
    if (pPars->fVerbose != 0) {
      Gia_ManEquivPrintClasses(pAig,0,0.0);
    }
    Ssc_GiaClassesCheckPairs(pAig,p->vDisPairs);
    p->vDisPairs->nSize = 0;
    aVar11 = Abc_Clock();
    p->timeSimSat = p->timeSimSat + (aVar11 - aVar9);
  }
  pGVar10 = Gia_ManEquivReduce(pAig,0,0,1,0);
  if (pGVar10 == (Gia_Man_t *)0x0) {
    puts("There is no equivalences.");
    if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
      free(pAig->pReprs);
      pAig->pReprs = (Gia_Rpr_t *)0x0;
    }
    if (pAig->pNexts != (int *)0x0) {
      free(pAig->pNexts);
      pAig->pNexts = (int *)0x0;
    }
    pGVar10 = Gia_ManDup(pAig);
  }
  p_00 = Gia_ManCleanup(pGVar10);
  Gia_ManStop(pGVar10);
  aVar9 = Abc_Clock();
  p->timeTotal = aVar9 - aVar8;
  if (pPars->fVerbose != 0) {
    Ssc_ManPrintStats(p);
  }
  Ssc_ManStop(p);
  if (pPars->fVerbose != 0) {
    uVar4 = Gia_ManAndNum(pAig);
    uVar7 = Gia_ManAndNum(p_00);
    Abc_Print(1,"Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ",
              100.0 - ((double)(int)uVar7 * 100.0) / (double)(int)uVar4,(ulong)uVar4,(ulong)uVar7);
    aVar9 = Abc_Clock();
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(aVar9 - aVar8) / 1000000.0);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingInt( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    Gia_Man_t * pResult, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    abctime clk, clkTotal = Abc_Clock();
    int i, fCompl, nRefined, status;
clk = Abc_Clock();
    assert( Gia_ManRegNum(pCare) == 0 );
    assert( Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare) );
    assert( Gia_ManIsNormalized(pAig) );
    assert( Gia_ManIsNormalized(pCare) );
    // reset random numbers
    Gia_ManRandom( 1 );
    // sweeping manager
    p = Ssc_ManStart( pAig, pCare, pPars );
    if ( p == (Ssc_Man_t *)(ABC_PTRINT_T)1 ) // UNSAT
        return Gia_ManDupZero( pAig );
    if ( p == NULL ) // timeout
        return Gia_ManDup( pAig );
    if ( p->pPars->fVerbose )
        printf( "Care set produced %d hits out of %d.\n", Ssc_GiaEstimateCare(p->pFraig, 5), 640 );
    // perform simulation 
    while ( 1 ) 
    {
        // simulate care set
        Ssc_GiaRandomPiPattern( p->pFraig, 5, NULL );
        Ssc_GiaSimRound( p->pFraig );
        // transfer care patterns to user's AIG
        if ( !Ssc_GiaTransferPiPattern( pAig, p->pFraig, p->vPivot ) )
            break;
        // simulate the main AIG
        Ssc_GiaSimRound( pAig );
        nRefined = Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        if ( nRefined <= Gia_ManCandNum(pAig) / 100 )
            break;
    }
p->timeSimInit += Abc_Clock() - clk;

    // prepare user's AIG
    Gia_ManFillValue(pAig);
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_Obj2Lit( p->pFraig, Gia_ManCi(p->pFraig, i) );
//    Gia_ManLevelNum(pAig);
    // prepare swept AIG (should be done after starting SAT solver in Ssc_ManStart)
    Gia_ManHashStart( p->pFraig );
    // perform sweeping
    Ssc_GiaResetPiPattern( pAig, pPars->nWords );
    Ssc_GiaSavePiPattern( pAig, p->vPivot );
    Gia_ManForEachCand( pAig, pObj, i )
    {
        if ( pAig->iPatsPi == 64 * pPars->nWords )
        {
clk = Abc_Clock();
            Ssc_GiaSimRound( pAig );
            Ssc_GiaClassesRefine( pAig );
            if ( pPars->fVerbose ) 
                Gia_ManEquivPrintClasses( pAig, 0, 0 );
            Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
            Vec_IntClear( p->vDisPairs );
            // prepare next patterns
            Ssc_GiaResetPiPattern( pAig, pPars->nWords );
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
p->timeSimSat += Abc_Clock() - clk;
//printf( "\n" );
        }
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pFraig, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Gia_ObjHasRepr(pAig, i) )
            continue;
        pRepr = Gia_ObjReprObj(pAig, i);
        if ( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase ) )
        {
            Gia_ObjSetProved( pAig, i );
            continue;
        }
        assert( Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value) );
        fCompl = pRepr->fPhase ^ pObj->fPhase ^ Abc_LitIsCompl(pRepr->Value) ^ Abc_LitIsCompl(pObj->Value);

        // perform SAT call
clk = Abc_Clock();
        p->nSatCalls++;
        status = Ssc_ManCheckEquivalence( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
            Gia_ObjSetProved( pAig, i );
        }
        else if ( status == l_True )
        {
            p->nSatCallsSat++;
            Ssc_GiaSavePiPattern( pAig, p->vPattern );
            Vec_IntPush( p->vDisPairs, Gia_ObjRepr(p->pAig, i) );
            Vec_IntPush( p->vDisPairs, i );
//            printf( "Try %2d and %2d: ", Gia_ObjRepr(p->pAig, i), i );
//            Vec_IntPrint( p->vPattern );
            if ( Gia_ObjRepr(p->pAig, i) > 0 )
                Ssc_GiaResimulateOneClass( p, Gia_ObjRepr(p->pAig, i), i );
        }
        else if ( status == l_Undef )
            p->nSatCallsUndec++;
        else assert( 0 );
p->timeSat += Abc_Clock() - clk;
    }
    if ( pAig->iPatsPi > 1 )
    {
clk = Abc_Clock();
        while ( pAig->iPatsPi < 64 * pPars->nWords )
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
        Ssc_GiaSimRound( pAig );
        Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
        Vec_IntClear( p->vDisPairs );
p->timeSimSat += Abc_Clock() - clk;
    }
//    Gia_ManEquivPrintClasses( pAig, 1, 0 );
//    Gia_ManPrint( pAig );

    // generate the resulting AIG
    pResult = Gia_ManEquivReduce( pAig, 0, 0, 1, 0 );
    if ( pResult == NULL )
    {
        printf( "There is no equivalences.\n" );
        ABC_FREE( pAig->pReprs );
        ABC_FREE( pAig->pNexts );
        pResult = Gia_ManDup( pAig );
    }
    pResult = Gia_ManCleanup( pTemp = pResult );
    Gia_ManStop( pTemp );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( pPars->fVerbose )
        Ssc_ManPrintStats( p );
    Ssc_ManStop( p );
    // count the number of representatives
    if ( pPars->fVerbose ) 
    {
        Abc_Print( 1, "Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pResult), 
            100.0 - 100.0 * Gia_ManAndNum(pResult) / Gia_ManAndNum(pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    return pResult;
}